

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ll.c
# Opt level: O1

int unlink(char *__name)

{
  atomic_size_t *paVar1;
  long *plVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  ll_elem *plVar6;
  ll_elem *plVar8;
  atomic_size_t aVar9;
  ll_elem *n;
  int iVar10;
  ulong in_RSI;
  ll_elem *plVar11;
  bool bVar12;
  ll_elem *plVar7;
  
  if (((ulong)__name & 3) != 0) {
    __assert_fail("q == ptr_clear(q)",
                  "/workspace/llm4binary/github/license_c_cmakelists/nahratzah[P]ll/src/ll.c",0x267,
                  "int unlink(struct ll_head *, struct ll_elem *)");
  }
  n = (ll_elem *)(in_RSI & 0xfffffffffffffffc);
  if (n == (ll_elem *)0x0) {
    __assert_fail("n != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/nahratzah[P]ll/src/ll.c",0x269,
                  "int unlink(struct ll_head *, struct ll_elem *)");
  }
  iVar10 = 0;
  if (n->succ < 4) {
    return 0;
  }
  do {
  } while ((n->succ & 2) != 0);
  do {
    plVar8 = pred((ll_head *)__name,n);
    plVar11 = (ll_elem *)((ulong)plVar8 & 0xfffffffffffffffc);
    if (plVar11 == (ll_elem *)0x0) {
      return 0;
    }
    if (((ulong)plVar8 & 2) != 0) {
LAB_001016e4:
      LOCK();
      paVar1 = &plVar11->refcnt;
      aVar9 = *paVar1;
      *paVar1 = *paVar1 - 1;
      UNLOCK();
      goto LAB_001016f1;
    }
    do {
      uVar4 = plVar11->succ;
      do {
        LOCK();
        uVar5 = plVar11->succ;
        bVar12 = uVar4 == uVar5;
        if (bVar12) {
          plVar11->succ = uVar4 | 1;
          uVar5 = uVar4;
        }
        UNLOCK();
        uVar4 = uVar5;
      } while (!bVar12);
    } while (((uVar5 & 1) != 0) && ((ll_elem *)(uVar5 & 0xfffffffffffffffc) == n));
    if ((ll_elem *)(uVar5 & 0xfffffffffffffffc) == n) {
      if ((uVar5 & 1) != 0) {
        __assert_fail("clear_deref",
                      "/workspace/llm4binary/github/license_c_cmakelists/nahratzah[P]ll/src/ll.c",
                      0x24f,
                      "int unlink_ps_lock(struct ll_head *, struct ll_elem *, struct ll_elem *)");
      }
    }
    else if ((uVar5 & 1) == 0) {
      LOCK();
      uVar4 = plVar11->succ;
      plVar11->succ = plVar11->succ & 0xfffffffffffffffe;
      UNLOCK();
      if ((uVar4 & 1) == 0) goto LAB_00101741;
    }
    if ((ll_elem *)(uVar5 & 0xfffffffffffffffc) == n) {
      if ((plVar11->succ & 1) == 0) {
        __assert_fail("atomic_load_explicit(&ptr_clear(p)->succ, memory_order_relaxed) & DEREF",
                      "/workspace/llm4binary/github/license_c_cmakelists/nahratzah[P]ll/src/ll.c",
                      0x292,"int unlink(struct ll_head *, struct ll_elem *)");
      }
      if ((ll_elem *)(plVar11->succ & 0xfffffffffffffffc) != n) {
        __assert_fail("ptr_clear((struct ll_elem*)atomic_load_explicit( &ptr_clear(p)->succ, memory_order_relaxed)) == n"
                      ,"/workspace/llm4binary/github/license_c_cmakelists/nahratzah[P]ll/src/ll.c",
                      0x294,"int unlink(struct ll_head *, struct ll_elem *)");
      }
      if ((ll_elem *)(plVar11->succ & 0xfffffffffffffffc) != n) {
        __assert_fail("ptr_clear((struct ll_elem*)atomic_load_explicit( &ptr_clear(p)->succ, memory_order_relaxed)) == n"
                      ,"/workspace/llm4binary/github/license_c_cmakelists/nahratzah[P]ll/src/ll.c",
                      0x2a6,"int unlink(struct ll_head *, struct ll_elem *)");
      }
      if (((ulong)plVar8 & 1) != 0) {
        __assert_fail("!((uintptr_t)p & DEREF)",
                      "/workspace/llm4binary/github/license_c_cmakelists/nahratzah[P]ll/src/ll.c",
                      0x2a7,"int unlink(struct ll_head *, struct ll_elem *)");
      }
      plVar6 = plVar8;
      do {
        LOCK();
        plVar7 = (ll_elem *)n->pred;
        bVar12 = plVar6 == plVar7;
        if (bVar12) {
          n->pred = (ulong)plVar8 | 2;
          plVar7 = plVar6;
        }
        UNLOCK();
        if (bVar12) {
          LOCK();
          uVar4 = plVar11->succ;
          plVar11->succ = plVar11->succ & 0xfffffffffffffffe;
          UNLOCK();
          if ((uVar4 & 1) == 0) goto LAB_00101741;
          plVar8 = succ((ll_head *)__name,plVar11);
          LOCK();
          plVar2 = (long *)(((ulong)plVar8 & 0xfffffffffffffffc) + 0x10);
          lVar3 = *plVar2;
          *plVar2 = *plVar2 + -1;
          UNLOCK();
          if (lVar3 == 0) goto LAB_001016a9;
          LOCK();
          paVar1 = &plVar11->refcnt;
          aVar9 = *paVar1;
          *paVar1 = *paVar1 - 1;
          UNLOCK();
          if (aVar9 == 0) goto LAB_001016a9;
          LOCK();
          *(long *)(__name + 0x18) = *(long *)(__name + 0x18) + -1;
          UNLOCK();
          plVar8 = succ((ll_head *)__name,n);
          goto LAB_00101648;
        }
        if (((ulong)plVar7 & 2) != 0) {
          LOCK();
          uVar4 = plVar11->succ;
          plVar11->succ = plVar11->succ & 0xfffffffffffffffe;
          UNLOCK();
          if ((uVar4 & 1) != 0) goto LAB_001016e4;
          goto LAB_00101741;
        }
        plVar6 = plVar11;
      } while ((ll_elem *)((ulong)plVar7 & 0xfffffffffffffffc) == plVar11);
      LOCK();
      uVar4 = plVar11->succ;
      plVar11->succ = plVar11->succ & 0xfffffffffffffffe;
      UNLOCK();
      if ((uVar4 & 1) == 0) {
LAB_00101741:
        __assert_fail("p & DEREF",
                      "/workspace/llm4binary/github/license_c_cmakelists/nahratzah[P]ll/src/ll.c",
                      0xf5,"void ptr_clear_deref(elem_ptr_t *)");
      }
    }
    LOCK();
    paVar1 = &plVar11->refcnt;
    aVar9 = *paVar1;
    *paVar1 = *paVar1 - 1;
    UNLOCK();
  } while (aVar9 != 0);
  goto LAB_001016a9;
  while( true ) {
    if (plVar11 == (ll_elem *)__name) goto LAB_001016c8;
    plVar8 = succ((ll_head *)__name,plVar11);
    LOCK();
    paVar1 = &plVar11->refcnt;
    aVar9 = *paVar1;
    *paVar1 = *paVar1 - 1;
    UNLOCK();
    if (aVar9 == 0) break;
LAB_00101648:
    plVar11 = (ll_elem *)((ulong)plVar8 & 0xfffffffffffffffc);
    if (n->refcnt < 2) {
LAB_001016c8:
      LOCK();
      paVar1 = &plVar11->refcnt;
      aVar9 = *paVar1;
      *paVar1 = *paVar1 - 1;
      UNLOCK();
      iVar10 = 1;
LAB_001016f1:
      if (aVar9 != 0) {
        return iVar10;
      }
      break;
    }
    if ((ll_elem *)(plVar11->pred & 0xfffffffffffffffc) == n) {
      plVar8 = pred((ll_head *)__name,plVar11);
      LOCK();
      plVar2 = (long *)(((ulong)plVar8 & 0xfffffffffffffffc) + 0x10);
      lVar3 = *plVar2;
      *plVar2 = *plVar2 + -1;
      UNLOCK();
      if (lVar3 == 0) break;
    }
  }
LAB_001016a9:
  __assert_fail("old >= count",
                "/workspace/llm4binary/github/license_c_cmakelists/nahratzah[P]ll/src/ll.c",0x9a,
                "void deref_release(struct ll_head *, struct ll_elem *, size_t)");
}

Assistant:

static int
unlink(struct ll_head *q_head, struct ll_elem *n)
{
	struct ll_elem	*q, *p, *p_, *i, *i_;

	q = &q_head->q;
	/* Argument validation. */
	assert(q == ptr_clear(q));
	n = ptr_clear(n);
	assert(n != NULL);

	/*
	 * Since we hold the reference to n, it cannot be removed completely
	 * before we return.
	 * However it can be that this function was called while n is not on
	 * the queue, hence test that now and fail if that is the case.
	 */
	if (ptr_clear((struct ll_elem*)atomic_load_explicit(&n->succ,
	    memory_order_relaxed)) == NULL)
		return 0;

	/* Ensure n is not halfway an insert. */
	while (atomic_load_explicit(&n->succ, memory_order_relaxed) & FLAGGED)
		SPINWAIT();

restart:
	/*
	 * Update n->pred to the deleted state, taking care n->pred->succ
	 * points at n.
	 * Fails if n->pred is already marked as deleted.
	 */
	for (;;) {
		p = pred(q_head, n);
		/*
		 * p can become null, if we acquired our reference between
		 * another unlink_release detecting a refcnt of 1 and
		 * it clearing its pred/succ pointers.
		 */
		if (ptr_clear(p) == NULL)
			return 0;

		if (deleted_ptr(p)) {
			/* Another thread marked n->pred with deletion. */
			deref_release(q_head, p, 1);
			return 0;
		}

		/* Lock down p->succ and ensure it points at n. */
		if (unlink_ps_lock(q_head, p, n)) {
			assert(atomic_load_explicit(&ptr_clear(p)->succ,
			    memory_order_relaxed) & DEREF);
			assert(ptr_clear((struct ll_elem*)atomic_load_explicit(
			    &ptr_clear(p)->succ, memory_order_relaxed)) == n);
			break;			/* GUARD */
		}

		/*
		 * p no longer points at n.  Re-resolve p.
		 */
		deref_release(q_head, p, 1);
	}
	/*
	 * p - direct predecessor of n.
	 * p->succ - locked, pointing at n.
	 *
	 * Update n->prev to point at p and mark it as deleted.
	 * Note that another thread can have acquired the deletion mark,
	 * between our looking up of the predecessor and locking down p->succ.
	 */
	assert(ptr_clear((struct ll_elem*)atomic_load_explicit(
	    &ptr_clear(p)->succ, memory_order_relaxed)) == n);
	assert(!((uintptr_t)p & DEREF));
	assert(!((uintptr_t)p & FLAGGED));

	/* Acquire deletion lock. */
	p_ = p;
	p = ptr_clear(p);
	while (!atomic_compare_exchange_weak_explicit(&n->pred,
	    (uintptr_t*)&p_, (uintptr_t)p | FLAGGED,
	    memory_order_acq_rel, memory_order_relaxed)) {
		if (((uintptr_t)p_ & FLAGGED) || ptr_clear(p_) != p) {
			/* We have to restart or abort. */
			ptr_clear_deref(&p->succ);
			deref_release(q_head, p, 1);

			/* Another thread deleted n. */
			if ((uintptr_t)p_ & FLAGGED)
				return 0;
			/*
			 * n->pred changed from under us (indicates p is being
			 * deleted as well).
			 */
			goto restart;
		}

		assert(ptr_clear(p_) == p);
		p_ = p;
		SPINWAIT();
	}
	ptr_clear_deref(&p->succ);	/* Unlock p->succ. */

	/*
	 * n is succesfully marked as deleted,
	 * with the correct value for n->pred
	 * (the immediate predecessor, as required by the invariants).
	 *
	 * Update our predecessor p to skip n.
	 */
	deref_release(q_head, succ(q_head, p), 1);
	deref_release(q_head, p, 1);
	atomic_fetch_sub_explicit(&q_head->size, 1, memory_order_relaxed);

	/*
	 * Loop the list forward, clearing up references until our refcount
	 * becomes 1 or the list is exhausted.
	 */
	i = ptr_clear(succ(q_head, n));
	while (atomic_load_explicit(&n->refcnt, memory_order_relaxed) > 1) {
		/* If i points at n, update its pred pointer. */
		if (ptr_clear((struct ll_elem*)atomic_load_explicit(&i->pred,
		    memory_order_relaxed)) == n)
			deref_release(q_head, pred(q_head, i), 1);

		/* GUARD: stop at end of q. */
		if (i == q)
			break;

		/* Skip to next element. */
		i_ = i;
		i = ptr_clear(succ(q_head, i));
		deref_release(q_head, i_, 1);
	}
	deref_release(q_head, i, 1);
	return 1;
}